

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall gl4cts::ShaderSubroutine::APITest2::initTest(APITest2 *this)

{
  ostringstream *poVar1;
  undefined8 uVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TestLog **__dest;
  TestError *pTVar7;
  GLint n_active_subroutine_uniforms;
  GLint n_active_subroutines;
  GLint link_status;
  GLint compile_status;
  string vs_body;
  char *vs_body_raw_ptr;
  size_type __dnew;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  TestLog **local_1d8;
  TestLog *local_1d0;
  TestLog *local_1c8 [2];
  TestLog **local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  GVar4 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po_id = GVar4;
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateProgram() or glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x76b);
  (**(code **)(lVar6 + 0x10))(this->m_po_id,this->m_vs_id);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glAttachShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x76f);
  local_1dc = 0;
  local_1b0._0_8_ = (TestLog *)0x1b4;
  local_1d8 = local_1c8;
  __dest = (TestLog **)std::__cxx11::string::_M_create((ulong *)&local_1d8,(ulong)local_1b0);
  uVar2 = local_1b0._0_8_;
  local_1c8[0] = (TestLog *)local_1b0._0_8_;
  local_1d8 = __dest;
  memcpy(__dest,
         "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine int ExampleSubroutineType(int example_argument);\n\nsubroutine(ExampleSubroutineType) int subroutine1(int example_argument)\n{\n    return 1;\n}\n\nsubroutine(ExampleSubroutineType) int subroutine2(int example_argument)\n{\n    return 2;\n}\n\nsubroutine uniform ExampleSubroutineType data_provider;\n\nvoid main()\n{\n    gl_Position = vec4(float(data_provider(0)), vec3(1) );\n}\n"
         ,0x1b4);
  local_1d0 = (TestLog *)uVar2;
  *(undefined1 *)((long)__dest + uVar2) = 0;
  local_1b8 = local_1d8;
  (**(code **)(lVar6 + 0x12b8))(this->m_vs_id,1,&local_1b8,0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x777);
  (**(code **)(lVar6 + 0x248))(this->m_vs_id);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCompileShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x77a);
  (**(code **)(lVar6 + 0xa70))(this->m_vs_id,0x8b81,&local_1dc);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x77d);
  if (local_1dc != 1) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Shader compilation failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x781);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1e0 = 0;
  (**(code **)(lVar6 + 0xce8))(this->m_po_id);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x788);
  (**(code **)(lVar6 + 0x9d8))(this->m_po_id,0x8b82,&local_1e0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x78b);
  if (local_1e0 == 1) {
    local_1e4 = 0;
    local_1e8 = 0;
    (**(code **)(lVar6 + 0x9d0))(this->m_po_id,0x8b31,0x8de5);
    (**(code **)(lVar6 + 0x9d0))(this->m_po_id,0x8b31,0x8de6,&local_1e8);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetProgramStageiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x798);
    if (local_1e4 == 2) {
      if (local_1e8 == 1) {
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,(ulong)((long)&local_1c8[0]->m_log + 1));
        }
        return;
      }
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Invalid amount of active subroutine uniforms reported: expected: 1, reported: ",
                 0x4e);
      std::ostream::operator<<(poVar1,local_1e8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid GL_ACTIVE_SUBROUTINE_UNIFORMS property value.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x7aa);
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Invalid amount of active subroutines reported; expected: 2, reported:",0x45);
      std::ostream::operator<<(poVar1,local_1e4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid GL_ACTIVE_SUBROUTINES property value.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x7a0);
    }
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Program linking failed.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x78f);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void APITest2::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate program & shader objects */
	m_po_id = gl.createProgram();
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() or glCreateShader() call(s) failed.");

	/* Attach the shader to the program object */
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

	/* Compile the shader */
	glw::GLint  compile_status  = GL_FALSE;
	std::string vs_body			= getVertexShaderBody();
	const char* vs_body_raw_ptr = vs_body.c_str();

	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	gl.compileShader(m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status != GL_TRUE)
	{
		TCU_FAIL("Shader compilation failed.");
	}

	/* Try to link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed.");
	}

	/* Perform a few sanity checks */
	glw::GLint n_active_subroutines			= 0;
	glw::GLint n_active_subroutine_uniforms = 0;

	gl.getProgramStageiv(m_po_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINES, &n_active_subroutines);
	gl.getProgramStageiv(m_po_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &n_active_subroutine_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramStageiv() call failed.");

	if (n_active_subroutines != 2 /* subroutines declared in vertex shader */)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid amount of active subroutines reported; expected: 2,"
													   " reported:"
						   << n_active_subroutines << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid GL_ACTIVE_SUBROUTINES property value.");
	}

	if (n_active_subroutine_uniforms != 1)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid amount of active subroutine uniforms reported: expected: 1,"
							  " reported: "
						   << n_active_subroutine_uniforms << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid GL_ACTIVE_SUBROUTINE_UNIFORMS property value.");
	}
}